

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

VendorType parseVendor(StringRef VendorName)

{
  bool bVar1;
  VendorType *pVVar2;
  StringLiteral local_be8;
  StringLiteral local_bd8;
  StringLiteral local_bc8;
  StringLiteral local_bb8;
  StringLiteral local_ba8;
  StringLiteral local_b98;
  StringLiteral local_b88;
  StringLiteral local_b78;
  StringLiteral local_b68;
  StringLiteral local_b58;
  StringLiteral local_b48;
  StringLiteral local_b38;
  StringLiteral local_b28;
  StringLiteral local_b18;
  StringLiteral local_b08;
  StringLiteral local_af8;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  Optional<llvm::Triple::VendorType> OStack_ac8;
  char *local_ac0;
  StringRef VendorName_local;
  VendorType local_a74;
  char **local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char **local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  int local_9f4;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  VendorType local_9cc;
  char **local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char **local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  int local_94c;
  char *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  VendorType local_924;
  char **local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char **local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  int local_8a4;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  VendorType local_87c;
  char **local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char **local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  int local_7fc;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  VendorType local_7d4;
  char **local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char **local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  int local_754;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  VendorType local_72c;
  char **local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char **local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  int local_6ac;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  VendorType local_684;
  char **local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char **local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  int local_604;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  VendorType local_5dc;
  char **local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char **local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  int local_55c;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  VendorType local_534;
  char **local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char **local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  int local_4b4;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  VendorType local_48c;
  char **local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char **local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  int local_40c;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  VendorType local_3e4;
  char **local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char **local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  int local_364;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  VendorType local_33c;
  char **local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char **local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  int local_2bc;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  VendorType local_294;
  char **local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char **local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  int local_214;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  VendorType local_1ec;
  char **local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char **local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  int local_16c;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  VendorType local_144;
  char **local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char **local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  int local_c4;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  VendorType local_9c;
  char **local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  int local_20;
  VendorType local_1c;
  char **local_18;
  VendorType local_c;
  
  local_ae0 = (char *)VendorName.Length;
  local_ae8 = VendorName.Data;
  VendorName_local.Length = (size_t)&local_ad8;
  local_ac0 = local_ae8;
  VendorName_local.Data = local_ae0;
  local_ad8 = local_ae8;
  local_ad0 = local_ae0;
  llvm::Optional<llvm::Triple::VendorType>::Optional(&OStack_ac8);
  llvm::StringLiteral::StringLiteral<6UL>(&local_af8,(char (*) [6])"apple");
  local_90 = local_af8.super_StringRef.Data;
  local_88 = (char *)local_af8.super_StringRef.Length;
  local_9c = Apple;
  local_98 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_b0 = local_ad8;
    local_a8 = local_ad0;
    local_c0 = local_90;
    local_b8 = local_88;
    local_70 = local_90;
    local_68 = local_88;
    local_80 = local_90;
    local_78 = local_88;
    local_48 = local_90;
    local_40 = local_88;
    local_50 = &local_60;
    bVar1 = false;
    local_60 = local_b0;
    local_58 = local_a8;
    if (local_ad0 == local_88) {
      local_28 = local_ad8;
      local_30 = local_90;
      local_38 = local_88;
      if (local_88 == (char *)0x0) {
        local_20 = 0;
      }
      else {
        local_20 = memcmp(local_ad8,local_90,(size_t)local_88);
      }
      bVar1 = local_20 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_9c);
    }
  }
  llvm::StringLiteral::StringLiteral<3UL>(&local_b08,(char (*) [3])0x364a5c);
  local_138 = local_b08.super_StringRef.Data;
  local_130 = (char *)local_b08.super_StringRef.Length;
  local_144 = PC;
  local_140 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_158 = local_ad8;
    local_150 = local_ad0;
    local_168 = local_138;
    local_160 = local_130;
    local_118 = local_138;
    local_110 = local_130;
    local_128 = local_138;
    local_120 = local_130;
    local_f0 = local_138;
    local_e8 = local_130;
    local_f8 = &local_108;
    bVar1 = false;
    local_108 = local_158;
    local_100 = local_150;
    if (local_ad0 == local_130) {
      local_d0 = local_ad8;
      local_d8 = local_138;
      local_e0 = local_130;
      if (local_130 == (char *)0x0) {
        local_c4 = 0;
      }
      else {
        local_c4 = memcmp(local_ad8,local_138,(size_t)local_130);
      }
      bVar1 = local_c4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_144);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_b18,(char (*) [5])"scei");
  local_1e0 = local_b18.super_StringRef.Data;
  local_1d8 = (char *)local_b18.super_StringRef.Length;
  local_1ec = SCEI;
  local_1e8 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_200 = local_ad8;
    local_1f8 = local_ad0;
    local_210 = local_1e0;
    local_208 = local_1d8;
    local_1c0 = local_1e0;
    local_1b8 = local_1d8;
    local_1d0 = local_1e0;
    local_1c8 = local_1d8;
    local_198 = local_1e0;
    local_190 = local_1d8;
    local_1a0 = &local_1b0;
    bVar1 = false;
    local_1b0 = local_200;
    local_1a8 = local_1f8;
    if (local_ad0 == local_1d8) {
      local_178 = local_ad8;
      local_180 = local_1e0;
      local_188 = local_1d8;
      if (local_1d8 == (char *)0x0) {
        local_16c = 0;
      }
      else {
        local_16c = memcmp(local_ad8,local_1e0,(size_t)local_1d8);
      }
      bVar1 = local_16c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_1ec);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_b28,(char (*) [4])"bgp");
  local_288 = local_b28.super_StringRef.Data;
  local_280 = (char *)local_b28.super_StringRef.Length;
  local_294 = BGP;
  local_290 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_2a8 = local_ad8;
    local_2a0 = local_ad0;
    local_2b8 = local_288;
    local_2b0 = local_280;
    local_268 = local_288;
    local_260 = local_280;
    local_278 = local_288;
    local_270 = local_280;
    local_240 = local_288;
    local_238 = local_280;
    local_248 = &local_258;
    bVar1 = false;
    local_258 = local_2a8;
    local_250 = local_2a0;
    if (local_ad0 == local_280) {
      local_220 = local_ad8;
      local_228 = local_288;
      local_230 = local_280;
      if (local_280 == (char *)0x0) {
        local_214 = 0;
      }
      else {
        local_214 = memcmp(local_ad8,local_288,(size_t)local_280);
      }
      bVar1 = local_214 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_294);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_b38,(char (*) [4])"bgq");
  local_330 = local_b38.super_StringRef.Data;
  local_328 = (char *)local_b38.super_StringRef.Length;
  local_33c = BGQ;
  local_338 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_350 = local_ad8;
    local_348 = local_ad0;
    local_360 = local_330;
    local_358 = local_328;
    local_310 = local_330;
    local_308 = local_328;
    local_320 = local_330;
    local_318 = local_328;
    local_2e8 = local_330;
    local_2e0 = local_328;
    local_2f0 = &local_300;
    bVar1 = false;
    local_300 = local_350;
    local_2f8 = local_348;
    if (local_ad0 == local_328) {
      local_2c8 = local_ad8;
      local_2d0 = local_330;
      local_2d8 = local_328;
      if (local_328 == (char *)0x0) {
        local_2bc = 0;
      }
      else {
        local_2bc = memcmp(local_ad8,local_330,(size_t)local_328);
      }
      bVar1 = local_2bc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_33c);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_b48,(char (*) [4])"fsl");
  local_3d8 = local_b48.super_StringRef.Data;
  local_3d0 = (char *)local_b48.super_StringRef.Length;
  local_3e4 = Freescale;
  local_3e0 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_3f8 = local_ad8;
    local_3f0 = local_ad0;
    local_408 = local_3d8;
    local_400 = local_3d0;
    local_3b8 = local_3d8;
    local_3b0 = local_3d0;
    local_3c8 = local_3d8;
    local_3c0 = local_3d0;
    local_390 = local_3d8;
    local_388 = local_3d0;
    local_398 = &local_3a8;
    bVar1 = false;
    local_3a8 = local_3f8;
    local_3a0 = local_3f0;
    if (local_ad0 == local_3d0) {
      local_370 = local_ad8;
      local_378 = local_3d8;
      local_380 = local_3d0;
      if (local_3d0 == (char *)0x0) {
        local_364 = 0;
      }
      else {
        local_364 = memcmp(local_ad8,local_3d8,(size_t)local_3d0);
      }
      bVar1 = local_364 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_3e4);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_b58,(char (*) [4])"ibm");
  local_480 = local_b58.super_StringRef.Data;
  local_478 = (char *)local_b58.super_StringRef.Length;
  local_48c = IBM;
  local_488 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_4a0 = local_ad8;
    local_498 = local_ad0;
    local_4b0 = local_480;
    local_4a8 = local_478;
    local_460 = local_480;
    local_458 = local_478;
    local_470 = local_480;
    local_468 = local_478;
    local_438 = local_480;
    local_430 = local_478;
    local_440 = &local_450;
    bVar1 = false;
    local_450 = local_4a0;
    local_448 = local_498;
    if (local_ad0 == local_478) {
      local_418 = local_ad8;
      local_420 = local_480;
      local_428 = local_478;
      if (local_478 == (char *)0x0) {
        local_40c = 0;
      }
      else {
        local_40c = memcmp(local_ad8,local_480,(size_t)local_478);
      }
      bVar1 = local_40c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_48c);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_b68,(char (*) [4])"img");
  local_528 = local_b68.super_StringRef.Data;
  local_520 = (char *)local_b68.super_StringRef.Length;
  local_534 = ImaginationTechnologies;
  local_530 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_548 = local_ad8;
    local_540 = local_ad0;
    local_558 = local_528;
    local_550 = local_520;
    local_508 = local_528;
    local_500 = local_520;
    local_518 = local_528;
    local_510 = local_520;
    local_4e0 = local_528;
    local_4d8 = local_520;
    local_4e8 = &local_4f8;
    bVar1 = false;
    local_4f8 = local_548;
    local_4f0 = local_540;
    if (local_ad0 == local_520) {
      local_4c0 = local_ad8;
      local_4c8 = local_528;
      local_4d0 = local_520;
      if (local_520 == (char *)0x0) {
        local_4b4 = 0;
      }
      else {
        local_4b4 = memcmp(local_ad8,local_528,(size_t)local_520);
      }
      bVar1 = local_4b4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_534);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_b78,(char (*) [4])"mti");
  local_5d0 = local_b78.super_StringRef.Data;
  local_5c8 = (char *)local_b78.super_StringRef.Length;
  local_5dc = MipsTechnologies;
  local_5d8 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_5f0 = local_ad8;
    local_5e8 = local_ad0;
    local_600 = local_5d0;
    local_5f8 = local_5c8;
    local_5b0 = local_5d0;
    local_5a8 = local_5c8;
    local_5c0 = local_5d0;
    local_5b8 = local_5c8;
    local_588 = local_5d0;
    local_580 = local_5c8;
    local_590 = &local_5a0;
    bVar1 = false;
    local_5a0 = local_5f0;
    local_598 = local_5e8;
    if (local_ad0 == local_5c8) {
      local_568 = local_ad8;
      local_570 = local_5d0;
      local_578 = local_5c8;
      if (local_5c8 == (char *)0x0) {
        local_55c = 0;
      }
      else {
        local_55c = memcmp(local_ad8,local_5d0,(size_t)local_5c8);
      }
      bVar1 = local_55c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_5dc);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_b88,(char (*) [7])"nvidia");
  local_678 = local_b88.super_StringRef.Data;
  local_670 = (char *)local_b88.super_StringRef.Length;
  local_684 = NVIDIA;
  local_680 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_698 = local_ad8;
    local_690 = local_ad0;
    local_6a8 = local_678;
    local_6a0 = local_670;
    local_658 = local_678;
    local_650 = local_670;
    local_668 = local_678;
    local_660 = local_670;
    local_630 = local_678;
    local_628 = local_670;
    local_638 = &local_648;
    bVar1 = false;
    local_648 = local_698;
    local_640 = local_690;
    if (local_ad0 == local_670) {
      local_610 = local_ad8;
      local_618 = local_678;
      local_620 = local_670;
      if (local_670 == (char *)0x0) {
        local_604 = 0;
      }
      else {
        local_604 = memcmp(local_ad8,local_678,(size_t)local_670);
      }
      bVar1 = local_604 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_684);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_b98,(char (*) [4])"csr");
  local_720 = local_b98.super_StringRef.Data;
  local_718 = (char *)local_b98.super_StringRef.Length;
  local_72c = CSR;
  local_728 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_740 = local_ad8;
    local_738 = local_ad0;
    local_750 = local_720;
    local_748 = local_718;
    local_700 = local_720;
    local_6f8 = local_718;
    local_710 = local_720;
    local_708 = local_718;
    local_6d8 = local_720;
    local_6d0 = local_718;
    local_6e0 = &local_6f0;
    bVar1 = false;
    local_6f0 = local_740;
    local_6e8 = local_738;
    if (local_ad0 == local_718) {
      local_6b8 = local_ad8;
      local_6c0 = local_720;
      local_6c8 = local_718;
      if (local_718 == (char *)0x0) {
        local_6ac = 0;
      }
      else {
        local_6ac = memcmp(local_ad8,local_720,(size_t)local_718);
      }
      bVar1 = local_6ac == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_72c);
    }
  }
  llvm::StringLiteral::StringLiteral<7UL>(&local_ba8,(char (*) [7])"myriad");
  local_7c8 = local_ba8.super_StringRef.Data;
  local_7c0 = (char *)local_ba8.super_StringRef.Length;
  local_7d4 = Myriad;
  local_7d0 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_7e8 = local_ad8;
    local_7e0 = local_ad0;
    local_7f8 = local_7c8;
    local_7f0 = local_7c0;
    local_7a8 = local_7c8;
    local_7a0 = local_7c0;
    local_7b8 = local_7c8;
    local_7b0 = local_7c0;
    local_780 = local_7c8;
    local_778 = local_7c0;
    local_788 = &local_798;
    bVar1 = false;
    local_798 = local_7e8;
    local_790 = local_7e0;
    if (local_ad0 == local_7c0) {
      local_760 = local_ad8;
      local_768 = local_7c8;
      local_770 = local_7c0;
      if (local_7c0 == (char *)0x0) {
        local_754 = 0;
      }
      else {
        local_754 = memcmp(local_ad8,local_7c8,(size_t)local_7c0);
      }
      bVar1 = local_754 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_7d4);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_bb8,(char (*) [4])"amd");
  local_870 = local_bb8.super_StringRef.Data;
  local_868 = (char *)local_bb8.super_StringRef.Length;
  local_87c = AMD;
  local_878 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_890 = local_ad8;
    local_888 = local_ad0;
    local_8a0 = local_870;
    local_898 = local_868;
    local_850 = local_870;
    local_848 = local_868;
    local_860 = local_870;
    local_858 = local_868;
    local_828 = local_870;
    local_820 = local_868;
    local_830 = &local_840;
    bVar1 = false;
    local_840 = local_890;
    local_838 = local_888;
    if (local_ad0 == local_868) {
      local_808 = local_ad8;
      local_810 = local_870;
      local_818 = local_868;
      if (local_868 == (char *)0x0) {
        local_7fc = 0;
      }
      else {
        local_7fc = memcmp(local_ad8,local_870,(size_t)local_868);
      }
      bVar1 = local_7fc == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_87c);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_bc8,(char (*) [5])"mesa");
  local_918 = local_bc8.super_StringRef.Data;
  local_910 = (char *)local_bc8.super_StringRef.Length;
  local_924 = Mesa;
  local_920 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_938 = local_ad8;
    local_930 = local_ad0;
    local_948 = local_918;
    local_940 = local_910;
    local_8f8 = local_918;
    local_8f0 = local_910;
    local_908 = local_918;
    local_900 = local_910;
    local_8d0 = local_918;
    local_8c8 = local_910;
    local_8d8 = &local_8e8;
    bVar1 = false;
    local_8e8 = local_938;
    local_8e0 = local_930;
    if (local_ad0 == local_910) {
      local_8b0 = local_ad8;
      local_8b8 = local_918;
      local_8c0 = local_910;
      if (local_910 == (char *)0x0) {
        local_8a4 = 0;
      }
      else {
        local_8a4 = memcmp(local_ad8,local_918,(size_t)local_910);
      }
      bVar1 = local_8a4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_924);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_bd8,(char (*) [5])"suse");
  local_9c0 = local_bd8.super_StringRef.Data;
  local_9b8 = (char *)local_bd8.super_StringRef.Length;
  local_9cc = SUSE;
  local_9c8 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_9e0 = local_ad8;
    local_9d8 = local_ad0;
    local_9f0 = local_9c0;
    local_9e8 = local_9b8;
    local_9a0 = local_9c0;
    local_998 = local_9b8;
    local_9b0 = local_9c0;
    local_9a8 = local_9b8;
    local_978 = local_9c0;
    local_970 = local_9b8;
    local_980 = &local_990;
    bVar1 = false;
    local_990 = local_9e0;
    local_988 = local_9d8;
    if (local_ad0 == local_9b8) {
      local_958 = local_ad8;
      local_960 = local_9c0;
      local_968 = local_9b8;
      if (local_9b8 == (char *)0x0) {
        local_94c = 0;
      }
      else {
        local_94c = memcmp(local_ad8,local_9c0,(size_t)local_9b8);
      }
      bVar1 = local_94c == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_9cc);
    }
  }
  llvm::StringLiteral::StringLiteral<3UL>(&local_be8,(char (*) [3])"oe");
  local_a68 = local_be8.super_StringRef.Data;
  local_a60 = (char *)local_be8.super_StringRef.Length;
  local_a74 = LastVendorType;
  local_a70 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (!bVar1) {
    local_a38 = local_ad8;
    local_a30 = local_ad0;
    local_a48 = local_a68;
    local_a40 = local_a60;
    local_a58 = local_a68;
    local_a50 = local_a60;
    local_a20 = local_a68;
    local_a18 = local_a60;
    local_a28 = &local_a38;
    bVar1 = false;
    if (local_ad0 == local_a60) {
      local_a00 = local_ad8;
      local_a08 = local_a68;
      local_a10 = local_a60;
      if (local_a60 == (char *)0x0) {
        local_9f4 = 0;
      }
      else {
        local_9f4 = memcmp(local_ad8,local_a68,(size_t)local_a60);
      }
      bVar1 = local_9f4 == 0;
    }
    if (bVar1) {
      llvm::Optional<llvm::Triple::VendorType>::operator=(&OStack_ac8,&local_a74);
    }
  }
  local_1c = UnknownVendor;
  local_18 = &local_ad8;
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_ac8);
  if (bVar1) {
    pVVar2 = llvm::Optional<llvm::Triple::VendorType>::operator*(&OStack_ac8);
    local_c = *pVVar2;
  }
  else {
    local_c = local_1c;
  }
  return local_c;
}

Assistant:

static Triple::VendorType parseVendor(StringRef VendorName) {
  return StringSwitch<Triple::VendorType>(VendorName)
    .Case("apple", Triple::Apple)
    .Case("pc", Triple::PC)
    .Case("scei", Triple::SCEI)
    .Case("bgp", Triple::BGP)
    .Case("bgq", Triple::BGQ)
    .Case("fsl", Triple::Freescale)
    .Case("ibm", Triple::IBM)
    .Case("img", Triple::ImaginationTechnologies)
    .Case("mti", Triple::MipsTechnologies)
    .Case("nvidia", Triple::NVIDIA)
    .Case("csr", Triple::CSR)
    .Case("myriad", Triple::Myriad)
    .Case("amd", Triple::AMD)
    .Case("mesa", Triple::Mesa)
    .Case("suse", Triple::SUSE)
    .Case("oe", Triple::OpenEmbedded)
    .Default(Triple::UnknownVendor);
}